

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

bool __thiscall RenX::Server::removeCommand(Server *this,string_view trigger)

{
  char cVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  
  __position._M_current =
       (this->m_commands).
       super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = __position._M_current !=
          (this->m_commands).
          super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    cVar1 = Jupiter::Command::matches
                      (((__position._M_current)->_M_t).
                       super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                       .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl,
                       trigger._M_len,trigger._M_str);
    while (cVar1 == '\0') {
      __position._M_current = __position._M_current + 1;
      bVar3 = __position._M_current ==
              (this->m_commands).
              super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = !bVar3;
      if (bVar3) {
        return bVar2;
      }
      cVar1 = Jupiter::Command::matches
                        (((__position._M_current)->_M_t).
                         super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                         .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl,
                         trigger._M_len,trigger._M_str);
    }
    std::
    vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
    ::_M_erase(&this->m_commands,__position);
  }
  return bVar2;
}

Assistant:

bool RenX::Server::isCratesEnabled() const {
	return m_spawnCrates;
}